

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O0

double getDistance(Mesh *mesh,VectorXd *params,EdgeHandle *e,VertexHandle *p)

{
  CoeffReturnType pdVar1;
  BaseHandle *in_RCX;
  undefined4 *in_RDX;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_RDI;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dis;
  double projected;
  Vec2d point;
  Vec2d edge;
  Vec2d pend;
  Vec2d pst;
  int end;
  int st;
  ArrayKernel *in_stack_fffffffffffffe98;
  BaseHandle in_stack_fffffffffffffeb0;
  double local_a0;
  VectorT<double,2> local_80 [16];
  container local_70;
  VectorT<double,2> local_60 [16];
  VectorT<double,2> local_50 [16];
  undefined4 local_40;
  BaseHandle local_3c;
  BaseHandle local_38;
  int local_34;
  undefined4 local_30;
  BaseHandle local_2c;
  BaseHandle local_28;
  int local_24;
  BaseHandle *local_20;
  undefined4 *local_18;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *local_8;
  
  local_30 = *in_RDX;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_2c.idx_ =
       (int)OpenMesh::ArrayKernel::halfedge_handle
                      (in_stack_fffffffffffffe98,(BaseHandle)(int)in_RDI,0);
  local_28.idx_ =
       (int)OpenMesh::ArrayKernel::to_vertex_handle
                      (in_stack_fffffffffffffe98,(BaseHandle)(int)in_RDI);
  local_24 = OpenMesh::BaseHandle::idx(&local_28);
  local_40 = *local_18;
  local_3c.idx_ =
       (int)OpenMesh::ArrayKernel::halfedge_handle
                      (in_stack_fffffffffffffe98,(BaseHandle)(int)in_RDI,0);
  local_38.idx_ =
       (int)OpenMesh::ArrayKernel::from_vertex_handle
                      ((ArrayKernel *)local_8,in_stack_fffffffffffffeb0.idx_);
  local_34 = OpenMesh::BaseHandle::idx(&local_38);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     (in_RDI,(Index)in_stack_fffffffffffffe98);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     (in_RDI,(Index)in_stack_fffffffffffffe98);
  OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>(local_50,dVar3,*pdVar1);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     (in_RDI,(Index)in_stack_fffffffffffffe98);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     (in_RDI,(Index)in_stack_fffffffffffffe98);
  OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>(local_60,dVar3,*pdVar1);
  local_70._M_elems =
       (_Type)OpenMesh::VectorT<double,2>::operator-
                        ((VectorT<double,_2> *)local_8,(VectorT<double,_2> *)in_RDI);
  OpenMesh::BaseHandle::idx(local_20);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     (in_RDI,(Index)in_stack_fffffffffffffe98);
  dVar3 = *pdVar1;
  OpenMesh::BaseHandle::idx(local_20);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     (in_RDI,(Index)in_stack_fffffffffffffe98);
  OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>(local_80,dVar3,*pdVar1);
  OpenMesh::VectorT<double,2>::operator-((VectorT<double,_2> *)local_8,(VectorT<double,_2> *)in_RDI)
  ;
  dVar3 = OpenMesh::dot<double,2>
                    ((VectorT<double,_2> *)in_RDI,(VectorT<double,_2> *)in_stack_fffffffffffffe98);
  dVar4 = OpenMesh::VectorT<double,_2>::norm<double>((VectorT<double,_2> *)0x1cbd2d);
  OpenMesh::VectorT<double,2>::operator-((VectorT<double,_2> *)local_8,(VectorT<double,_2> *)in_RDI)
  ;
  OpenMesh::VectorT<double,2>::operator-((VectorT<double,_2> *)local_8,(VectorT<double,_2> *)in_RDI)
  ;
  dVar5 = OpenMesh::dot<double,2>
                    ((VectorT<double,_2> *)in_RDI,(VectorT<double,_2> *)in_stack_fffffffffffffe98);
  fVar2 = sqrtf((float)(dVar5 - dVar3 / dVar4));
  local_a0 = (double)fVar2;
  OpenMesh::VectorT<double,2>::operator-((VectorT<double,_2> *)local_8,(VectorT<double,_2> *)in_RDI)
  ;
  OpenMesh::VectorT<double,2>::operator-((VectorT<double,_2> *)local_8,(VectorT<double,_2> *)in_RDI)
  ;
  dVar3 = OpenMesh::dot<double,2>
                    ((VectorT<double,_2> *)in_RDI,(VectorT<double,_2> *)in_stack_fffffffffffffe98);
  if (0.0 <= dVar3) {
    OpenMesh::VectorT<double,2>::operator-
              ((VectorT<double,_2> *)local_8,(VectorT<double,_2> *)in_RDI);
    OpenMesh::VectorT<double,2>::operator-
              ((VectorT<double,_2> *)local_8,(VectorT<double,_2> *)in_RDI);
    dVar3 = OpenMesh::dot<double,2>
                      ((VectorT<double,_2> *)in_RDI,(VectorT<double,_2> *)in_stack_fffffffffffffe98)
    ;
    if (dVar3 < 0.0) {
      OpenMesh::VectorT<double,2>::operator-
                ((VectorT<double,_2> *)local_8,(VectorT<double,_2> *)in_RDI);
      local_a0 = OpenMesh::VectorT<double,_2>::norm<double>((VectorT<double,_2> *)0x1cbef8);
    }
  }
  else {
    OpenMesh::VectorT<double,2>::operator-
              ((VectorT<double,_2> *)local_8,(VectorT<double,_2> *)in_RDI);
    local_a0 = OpenMesh::VectorT<double,_2>::norm<double>((VectorT<double,_2> *)0x1cbe62);
  }
  return local_a0;
}

Assistant:

double getDistance(const Mesh& mesh, const Eigen::VectorXd& params, const OpenMesh::EdgeHandle& e, const OpenMesh::VertexHandle& p) {
    int st = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
    int end = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
    OpenMesh::Vec2d pst(params[2 * st], params[2 * st + 1]); 
    OpenMesh::Vec2d pend(params[2 * end], params[2 * end + 1]); 
    OpenMesh::Vec2d edge = pend - pst;

    OpenMesh::Vec2d point(params[p.idx() * 2], params[p.idx() * 2 + 1]);
    double projected = OpenMesh::dot(point - pst, edge) / edge.norm();
    double dis = sqrtf(OpenMesh::dot(point - pst, point - pst) - projected);

    if (OpenMesh::dot(point - pend, pst - pend) < 0.0) 
        dis = (point - pend).norm();
    else if (OpenMesh::dot(point - pst, pend - pst) < 0.0) 
        dis = (point - pst).norm();

    return dis;
}